

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_binary.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  Offset<flatbuffers::String> off;
  Offset<flatbuffers::Vector<unsigned_char>_> off_00;
  Offset<MyGame::Sample::Monster> root;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  uoffset_t start;
  unsigned_short vtsize;
  long lVar8;
  Vec3 vec;
  FlatBufferBuilder builder;
  uchar inv_data [10];
  Vec3 local_94;
  FlatBufferBuilder local_88;
  uchar local_28 [16];
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder(&local_88,0x400);
  local_94.x_ = 1.0;
  local_94.y_ = 2.0;
  local_94.z_ = 3.0;
  off = flatbuffers::FlatBufferBuilder::CreateString(&local_88,"MyMonster",9);
  local_28[0] = '\0';
  local_28[1] = '\x01';
  local_28[2] = '\x02';
  local_28[3] = '\x03';
  local_28[4] = '\x04';
  local_28[5] = '\x05';
  local_28[6] = '\x06';
  local_28[7] = '\a';
  local_28[8] = '\b';
  local_28[9] = '\t';
  off_00 = flatbuffers::FlatBufferBuilder::CreateVector<unsigned_char>(&local_88,local_28,10);
  if (local_88.offsetbuf_.
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_88.offsetbuf_.
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("!offsetbuf_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                  ,0x183,"void flatbuffers::FlatBufferBuilder::NotNested()");
  }
  start = ((int)local_88.buf_.reserved_ - (int)local_88.buf_.cur_) + (int)local_88.buf_.buf_;
  flatbuffers::FlatBufferBuilder::AddOffset<flatbuffers::Vector<unsigned_char>>
            (&local_88,0xe,off_00);
  flatbuffers::FlatBufferBuilder::AddOffset<flatbuffers::String>(&local_88,10,off);
  flatbuffers::FlatBufferBuilder::AddStruct<MyGame::Sample::Vec3>(&local_88,4,&local_94);
  flatbuffers::FlatBufferBuilder::AddElement<short>(&local_88,8,0x50,100);
  flatbuffers::FlatBufferBuilder::AddElement<short>(&local_88,6,0x96,0x96);
  flatbuffers::FlatBufferBuilder::AddElement<signed_char>(&local_88,0x10,'\x02','\x02');
  root.o = flatbuffers::FlatBufferBuilder::EndTable(&local_88,start,7);
  flatbuffers::FlatBufferBuilder::Finish<MyGame::Sample::Monster>(&local_88,root);
  puVar6 = (uint *)CONCAT44(local_88.buf_.cur_._4_4_,(int)local_88.buf_.cur_);
  uVar7 = (ulong)*puVar6;
  lVar8 = -(long)*(int *)((long)puVar6 + uVar7);
  uVar3 = *(ushort *)((long)puVar6 + (uVar7 - (long)*(int *)((long)puVar6 + uVar7)));
  if (uVar3 < 9) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)((long)puVar6 + lVar8 + uVar7 + 8);
  }
  if ((uVar2 == 0) || (*(short *)((long)puVar6 + uVar2 + uVar7) != 0x50)) {
    __assert_fail("monster->hp() == 80",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x32,"int main(int, const char **)");
  }
  if (uVar3 < 7) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)*(ushort *)((long)puVar6 + lVar8 + uVar7 + 6);
  }
  if (((short)uVar5 != 0) && (*(short *)((long)puVar6 + uVar5 + uVar7) != 0x96)) {
    __assert_fail("monster->mana() == 150",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x33,"int main(int, const char **)");
  }
  if (uVar3 < 0xb) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)((long)puVar6 + lVar8 + uVar7 + 10);
  }
  iVar4 = strcmp((char *)((long)puVar6 +
                         (ulong)*(uint *)((long)puVar6 + uVar2 + uVar7) + uVar2 + uVar7 + 4),
                 "MyMonster");
  if (iVar4 == 0) {
    if (uVar3 < 5) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)((long)puVar6 + lVar8 + uVar7 + 4);
    }
    if (uVar2 == 0) {
      __assert_fail("pos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x37,"int main(int, const char **)");
    }
    fVar1 = *(float *)((long)puVar6 + (ulong)uVar2 + uVar7 + 8);
    if ((fVar1 != 3.0) || (NAN(fVar1))) {
      __assert_fail("pos->z() == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x38,"int main(int, const char **)");
    }
    if (uVar3 < 0xf) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)((long)puVar6 + lVar8 + uVar7 + 0xe);
    }
    if (uVar3 == 0) {
      puVar6 = (uint *)0x0;
    }
    else {
      puVar6 = (uint *)((long)puVar6 +
                       (ulong)*(uint *)((long)puVar6 + uVar3 + uVar7) + uVar3 + uVar7);
    }
    if (puVar6 != (uint *)0x0) {
      if (*puVar6 < 10) {
        __assert_fail("i < Length()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                      ,0xa7,
                      "return_type flatbuffers::Vector<unsigned char>::Get(uoffset_t) const [T = unsigned char]"
                     );
      }
      if (*(char *)((long)puVar6 + 0xd) == '\t') {
        if (local_88.vtables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.vtables_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_88.offsetbuf_.
            super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.offsetbuf_.
                          super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)CONCAT44(local_88.buf_.buf_._4_4_,(int)local_88.buf_.buf_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_88.buf_.buf_._4_4_,(int)local_88.buf_.buf_));
        }
        return 0;
      }
      __assert_fail("inv->Get(9) == 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x3c,"int main(int, const char **)");
    }
    __assert_fail("inv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x3b,"int main(int, const char **)");
  }
  __assert_fail("!strcmp(monster->name()->c_str(), \"MyMonster\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/samples/sample_binary.cpp"
                ,0x34,"int main(int, const char **)");
}

Assistant:

int main(int argc, const char *argv[]) {
  // Build up a serialized buffer algorithmically:
  flatbuffers::FlatBufferBuilder builder;

  auto vec = Vec3(1, 2, 3);

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  // Shortcut for creating monster with all fields set:
  auto mloc = CreateMonster(builder, &vec, 150, 80, name, inventory,
                            Color_Blue);

  builder.Finish(mloc);
  // We now have a FlatBuffer we can store or send somewhere.

  // ** file/network code goes here :) **
  // access builder.GetBufferPointer() for builder.GetSize() bytes

  // Instead, we're going to access it straight away.
  // Get access to the root:
  auto monster = GetMonster(builder.GetBufferPointer());

  assert(monster->hp() == 80);
  assert(monster->mana() == 150);  // default
  assert(!strcmp(monster->name()->c_str(), "MyMonster"));

  auto pos = monster->pos();
  assert(pos);
  assert(pos->z() == 3);

  auto inv = monster->inventory();
  assert(inv);
  assert(inv->Get(9) == 9);
}